

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-while-connecting.c
# Opt level: O2

int run_test_tcp_close_while_connecting(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_90;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("1.2.3.4",0x23a3,&addr);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(puVar2,&tcp_handle);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_connect(&connect_req,&tcp_handle,(sockaddr *)&addr,connect_cb);
      if (iVar1 == 0) {
        iVar1 = uv_timer_init(puVar2,&timer1_handle);
        if (iVar1 == 0) {
          iVar1 = uv_timer_start(&timer1_handle,timer1_cb,1,0);
          if (iVar1 == 0) {
            iVar1 = uv_timer_init(puVar2,&timer2_handle);
            if (iVar1 == 0) {
              iVar1 = uv_timer_start(&timer2_handle,timer2_cb,86400000,0);
              if (iVar1 == 0) {
                iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                if (iVar1 == 0) {
                  if (connect_cb_called == 1) {
                    if (timer1_cb_called == 1) {
                      if (close_cb_called == 2) {
                        puVar2 = uv_default_loop();
                        uv_walk(puVar2,close_walk_cb,(void *)0x0);
                        uv_run(puVar2,UV_RUN_DEFAULT);
                        puVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar2);
                        if (iVar1 == 0) {
                          if (netunreach_errors < 1) {
                            return 0;
                          }
                          goto LAB_00151dc4;
                        }
                        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                        uStack_90 = 0x5b;
                      }
                      else {
                        pcVar3 = "close_cb_called == 2";
                        uStack_90 = 0x59;
                      }
                    }
                    else {
                      pcVar3 = "timer1_cb_called == 1";
                      uStack_90 = 0x58;
                    }
                  }
                  else {
                    pcVar3 = "connect_cb_called == 1";
                    uStack_90 = 0x57;
                  }
                }
                else {
                  pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                  uStack_90 = 0x55;
                }
              }
              else {
                pcVar3 = "0 == uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0)";
                uStack_90 = 0x54;
              }
            }
            else {
              pcVar3 = "0 == uv_timer_init(loop, &timer2_handle)";
              uStack_90 = 0x53;
            }
          }
          else {
            pcVar3 = "0 == uv_timer_start(&timer1_handle, timer1_cb, 1, 0)";
            uStack_90 = 0x52;
          }
        }
        else {
          pcVar3 = "0 == uv_timer_init(loop, &timer1_handle)";
          uStack_90 = 0x51;
        }
      }
      else {
        if (iVar1 == -0x65) {
LAB_00151dc4:
          fprintf(_stderr,"%s\n","Network unreachable.");
          fflush(_stderr);
          return 1;
        }
        pcVar3 = "r == 0";
        uStack_90 = 0x50;
      }
    }
    else {
      pcVar3 = "0 == uv_tcp_init(loop, &tcp_handle)";
      uStack_90 = 0x49;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"1.2.3.4\", TEST_PORT, &addr)";
    uStack_90 = 0x48;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
          ,uStack_90,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_close_while_connecting) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("1.2.3.4", TEST_PORT, &addr));
  ASSERT(0 == uv_tcp_init(loop, &tcp_handle));
  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);
  ASSERT(0 == uv_timer_init(loop, &timer1_handle));
  ASSERT(0 == uv_timer_start(&timer1_handle, timer1_cb, 1, 0));
  ASSERT(0 == uv_timer_init(loop, &timer2_handle));
  ASSERT(0 == uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(connect_cb_called == 1);
  ASSERT(timer1_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();

  if (netunreach_errors > 0)
    RETURN_SKIP("Network unreachable.");

  return 0;
}